

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# empty.pb.cc
# Opt level: O1

void __thiscall google::protobuf::Empty::InternalSwap(Empty *this,Empty *other)

{
  UnknownFieldSet *other_00;
  InternalMetadata *this_00;
  
  this_00 = &(other->super_Message).super_MessageLite._internal_metadata_;
  if ((((ulong)(this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) == 0) &&
     (((ulong)this_00->ptr_ & 1) == 0)) {
    return;
  }
  if (((ulong)this_00->ptr_ & 1) == 0) {
    other_00 = internal::InternalMetadata::
               mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>(this_00);
  }
  else {
    other_00 = (UnknownFieldSet *)(((ulong)this_00->ptr_ & 0xfffffffffffffffe) + 8);
  }
  internal::InternalMetadata::DoSwap<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_,other_00);
  return;
}

Assistant:

void Empty::InternalSwap(Empty* other) {
  using std::swap;
  _internal_metadata_.Swap<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(&other->_internal_metadata_);
}